

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_manager.h
# Opt level: O0

void __thiscall filesystem::path::path(path *this,string *p)

{
  string *p_local;
  path *this_local;
  
  path(this);
  std::__cxx11::string::operator=((string *)this,(string *)p);
  NormalizePath(this);
  return;
}

Assistant:

path(const std::string& p) : path()
    {
        this->path_ = p;
        NormalizePath();
    }